

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

string * __thiscall
pobr::utils::CmdParser::getFlagValue
          (string *__return_storage_ptr__,CmdParser *this,string *flagName)

{
  pointer pbVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  pointer pbVar6;
  long lVar7;
  pointer pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fullFlagEq;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"--",flagName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = &local_60;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pbVar8 = (this->arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pbVar1 - (long)pbVar8;
  if (0 < lVar7 >> 7) {
    lVar5 = (lVar7 >> 7) + 1;
    do {
      lVar3 = std::__cxx11::string::find((char *)pbVar8,(ulong)local_70,0);
      pbVar6 = pbVar8;
      if (lVar3 != -1) goto LAB_0010e27a;
      lVar3 = std::__cxx11::string::find((char *)(pbVar8 + 1),(ulong)local_70,0);
      pbVar6 = pbVar8 + 1;
      if (lVar3 != -1) goto LAB_0010e27a;
      lVar3 = std::__cxx11::string::find((char *)(pbVar8 + 2),(ulong)local_70,0);
      pbVar6 = pbVar8 + 2;
      if (lVar3 != -1) goto LAB_0010e27a;
      lVar3 = std::__cxx11::string::find((char *)(pbVar8 + 3),(ulong)local_70,0);
      pbVar6 = pbVar8 + 3;
      if (lVar3 != -1) goto LAB_0010e27a;
      pbVar8 = pbVar8 + 4;
      lVar5 = lVar5 + -1;
      lVar7 = lVar7 + -0x80;
    } while (1 < lVar5);
  }
  lVar7 = lVar7 >> 5;
  if (lVar7 != 1) {
    pbVar6 = pbVar8;
    if (lVar7 != 2) {
      pbVar6 = pbVar1;
      if ((lVar7 != 3) ||
         (lVar7 = std::__cxx11::string::find((char *)pbVar8,(ulong)local_70,0), pbVar6 = pbVar8,
         lVar7 != -1)) goto LAB_0010e27a;
      pbVar6 = pbVar8 + 1;
    }
    lVar7 = std::__cxx11::string::find((char *)pbVar6,(ulong)local_70,0);
    if (lVar7 != -1) goto LAB_0010e27a;
    pbVar8 = pbVar6 + 1;
  }
  lVar7 = std::__cxx11::string::find((char *)pbVar8,(ulong)local_70,0);
  pbVar6 = pbVar1;
  if (lVar7 != -1) {
    pbVar6 = pbVar8;
  }
LAB_0010e27a:
  if (pbVar6 == (this->arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::find((char *)pbVar6,(ulong)local_70,0);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)pbVar6);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string
CmdParser::getFlagValue(const std::string& flagName)
const
{
    auto fullFlagEq = "--" + flagName + "=";

    auto iter = std::find_if(
        this->arguments.begin(),
        this->arguments.end(),
        [&fullFlagEq](const std::string& argument) -> bool
        {
            return argument.find(fullFlagEq) != std::string::npos;
        }
    );

    if (iter == this->arguments.end()) {
        return "";
    }

    auto valIter = (*iter).find(fullFlagEq) + fullFlagEq.length();

    return (*iter).substr(valIter);
}